

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

string * __thiscall
gl4cts::GPUShaderFP64Test9::getVertexShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,GPUShaderFP64Test9 *this,_test_case *test_case)

{
  string *psVar1;
  bool bVar2;
  ostream *poVar3;
  char *pcVar4;
  _variable_type type;
  _variable_type type_00;
  _variable_type type_01;
  _variable_type type_02;
  _variable_type extraout_EDX;
  _variable_type extraout_EDX_00;
  _variable_type type_03;
  _variable_type type_04;
  string *local_340;
  _variable_type local_2e0;
  allocator<char> local_2d9;
  uint n_variable_component_1;
  string ref2_variable_name;
  string ref2_variable_type;
  string ref2_variable_type_string;
  string ref2_variable_type_fp_string;
  uint local_250;
  _variable_type compatible_variable_type;
  uint n_ref2_case;
  uint n_variable_component;
  _variable_type local_224;
  _variable_type local_220;
  _variable_type transposed_matrix_variable_type;
  _variable_type result_variable_type;
  uint n_variable_components;
  string variable_type_string;
  string variable_type_fp_string;
  undefined1 local_1c8 [8];
  string result_variable_type_string;
  stringstream result_sstream;
  ostream local_198;
  _test_case *local_20;
  _test_case *test_case_local;
  GPUShaderFP64Test9 *this_local;
  
  local_20 = test_case;
  test_case_local = (_test_case *)this;
  this_local = (GPUShaderFP64Test9 *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream
            ((stringstream *)(result_variable_type_string.field_2._M_local_buf + 8));
  Utils::getVariableTypeString_abi_cxx11_
            ((string *)local_1c8,(Utils *)(ulong)local_20->variable_type,type);
  Utils::getFPVariableTypeStringForVariableType_abi_cxx11_
            ((string *)((long)&variable_type_string.field_2 + 8),
             (Utils *)(ulong)local_20->variable_type,type_00);
  Utils::getVariableTypeString_abi_cxx11_
            ((string *)&result_variable_type,(Utils *)(ulong)local_20->variable_type,type_01);
  transposed_matrix_variable_type =
       Utils::getNumberOfComponentsForVariableType(local_20->variable_type);
  if ((local_20->operation_type == OPERATION_TYPE_MULTIPLICATION) &&
     (bVar2 = Utils::isMatrixVariableType(local_20->variable_type), bVar2)) {
    local_224 = Utils::getTransposedMatrixVariableType(local_20->variable_type);
    local_220 = Utils::getPostMatrixMultiplicationVariableType(local_20->variable_type,local_224);
    Utils::getVariableTypeString_abi_cxx11_
              ((string *)&n_ref2_case,(Utils *)(ulong)local_220,type_02);
    std::__cxx11::string::operator=((string *)local_1c8,(string *)&n_ref2_case);
    std::__cxx11::string::~string((string *)&n_ref2_case);
    local_20->result_variable_type = local_220;
  }
  poVar3 = std::operator<<(&local_198,"#version 400\n\nout ");
  poVar3 = std::operator<<(poVar3,(string *)local_1c8);
  std::operator<<(poVar3,
                  " result;\nout ivec2 result_lt;\nout ivec2 result_lte;\nout ivec2 result_gt;\nout ivec2 result_gte;\nvoid main()\n{\n"
                 );
  poVar3 = std::operator<<(&local_198,(string *)&result_variable_type);
  poVar3 = std::operator<<(poVar3," reference1 = ");
  poVar3 = std::operator<<(poVar3,(string *)&result_variable_type);
  std::operator<<(poVar3,"(");
  for (compatible_variable_type = VARIABLE_TYPE_BOOL;
      compatible_variable_type < transposed_matrix_variable_type;
      compatible_variable_type = compatible_variable_type + VARIABLE_TYPE_BVEC2) {
    std::ostream::operator<<(&local_198,compatible_variable_type + VARIABLE_TYPE_BVEC2);
    if (compatible_variable_type != transposed_matrix_variable_type - VARIABLE_TYPE_BVEC2) {
      std::operator<<(&local_198,", ");
    }
  }
  std::operator<<(&local_198,");\n");
  for (local_250 = 0; local_250 < 2; local_250 = local_250 + 1) {
    ref2_variable_type_fp_string.field_2._12_4_ = local_20->variable_type;
    bVar2 = Utils::isMatrixVariableType(ref2_variable_type_fp_string.field_2._12_4_);
    type_03 = extraout_EDX;
    if ((bVar2) && (local_20->operation_type == OPERATION_TYPE_MULTIPLICATION)) {
      ref2_variable_type_fp_string.field_2._12_4_ =
           Utils::getTransposedMatrixVariableType(ref2_variable_type_fp_string.field_2._12_4_);
      type_03 = extraout_EDX_00;
    }
    Utils::getFPVariableTypeStringForVariableType_abi_cxx11_
              ((string *)((long)&ref2_variable_type_string.field_2 + 8),
               (Utils *)(ulong)(uint)ref2_variable_type_fp_string.field_2._12_4_,type_03);
    Utils::getVariableTypeString_abi_cxx11_
              ((string *)((long)&ref2_variable_type.field_2 + 8),
               (Utils *)(ulong)(uint)ref2_variable_type_fp_string.field_2._12_4_,type_04);
    if (local_250 == 0) {
      psVar1 = &ref2_variable_type_string;
    }
    else {
      psVar1 = &ref2_variable_type;
    }
    local_340 = (string *)((psVar1->field_2)._M_local_buf + 8);
    std::__cxx11::string::string((string *)(ref2_variable_name.field_2._M_local_buf + 8),local_340);
    pcVar4 = "reference2";
    if (local_250 == 0) {
      pcVar4 = "reference2f";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&n_variable_component_1,pcVar4,&local_2d9);
    std::allocator<char>::~allocator(&local_2d9);
    poVar3 = std::operator<<(&local_198,(string *)(ref2_variable_name.field_2._M_local_buf + 8));
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,(string *)&n_variable_component_1);
    poVar3 = std::operator<<(poVar3," = ");
    poVar3 = std::operator<<(poVar3,(string *)(ref2_variable_name.field_2._M_local_buf + 8));
    std::operator<<(poVar3,"(");
    for (local_2e0 = VARIABLE_TYPE_BOOL; local_2e0 < transposed_matrix_variable_type;
        local_2e0 = local_2e0 + VARIABLE_TYPE_BVEC2) {
      std::ostream::operator<<(&local_198,~local_2e0 + transposed_matrix_variable_type);
      if (local_2e0 != transposed_matrix_variable_type - VARIABLE_TYPE_BVEC2) {
        std::operator<<(&local_198,", ");
      }
    }
    std::operator<<(&local_198,");\n");
    std::__cxx11::string::~string((string *)&n_variable_component_1);
    std::__cxx11::string::~string((string *)(ref2_variable_name.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(ref2_variable_type.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(ref2_variable_type_string.field_2._M_local_buf + 8));
  }
  std::operator<<(&local_198,"\nresult = ");
  if ((local_20->operation_type == OPERATION_TYPE_PRE_DECREMENTATION) ||
     (local_20->operation_type == OPERATION_TYPE_PRE_INCREMENTATION)) {
    pcVar4 = getOperatorForOperationType(this,&local_20->operation_type);
    std::operator<<(&local_198,pcVar4);
  }
  std::operator<<(&local_198,"reference1 ");
  if ((((local_20->operation_type == OPERATION_TYPE_PRE_DECREMENTATION) ||
       (local_20->operation_type == OPERATION_TYPE_PRE_INCREMENTATION)) ||
      (local_20->operation_type == OPERATION_TYPE_POST_DECREMENTATION)) ||
     (local_20->operation_type == OPERATION_TYPE_POST_INCREMENTATION)) {
    if ((local_20->operation_type == OPERATION_TYPE_POST_DECREMENTATION) ||
       (local_20->operation_type == OPERATION_TYPE_POST_INCREMENTATION)) {
      pcVar4 = getOperatorForOperationType(this,&local_20->operation_type);
      std::operator<<(&local_198,pcVar4);
    }
  }
  else {
    pcVar4 = getOperatorForOperationType(this,&local_20->operation_type);
    poVar3 = std::operator<<(&local_198,pcVar4);
    std::operator<<(poVar3," reference2");
  }
  std::operator<<(&local_198,";\n");
  bVar2 = Utils::isScalarVariableType(local_20->variable_type);
  if (bVar2) {
    std::operator<<(&local_198,
                    "result_lt [0] = (reference1 <  reference2)  ? 1 : 0;\nresult_lt [1] = (reference1 <  reference2f) ? 1 : 0;\nresult_lte[0] = (reference1 <= reference2)  ? 1 : 0;\nresult_lte[1] = (reference1 <= reference2f) ? 1 : 0;\nresult_gt [0] = (reference1 >  reference2)  ? 1 : 0;\nresult_gt [1] = (reference1 >  reference2f) ? 1 : 0;\nresult_gte[0] = (reference1 >= reference2)  ? 1 : 0;\nresult_gte[1] = (reference1 >= reference2f) ? 1 : 0;\n"
                   );
  }
  else {
    std::operator<<(&local_198,
                    "result_lt [0] = 1;\nresult_lt [1] = 1;\nresult_lte[0] = 1;\nresult_lte[1] = 1;\nresult_gt [0] = 1;\nresult_gt [1] = 1;\nresult_gte[0] = 1;\nresult_gte[1] = 1;\n"
                   );
  }
  std::operator<<(&local_198,"}\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::string::~string((string *)&result_variable_type);
  std::__cxx11::string::~string((string *)(variable_type_string.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_1c8);
  std::__cxx11::stringstream::~stringstream
            ((stringstream *)(result_variable_type_string.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string GPUShaderFP64Test9::getVertexShaderBody(_test_case& test_case)
{
	std::stringstream  result_sstream;
	std::string		   result_variable_type_string = Utils::getVariableTypeString(test_case.variable_type);
	std::string		   variable_type_fp_string = Utils::getFPVariableTypeStringForVariableType(test_case.variable_type);
	std::string		   variable_type_string	= Utils::getVariableTypeString(test_case.variable_type);
	const unsigned int n_variable_components   = Utils::getNumberOfComponentsForVariableType(test_case.variable_type);

	/* If we are to multiply matrices, we will need to use a different type
	 * for the result variable if either of the matrices is not square.
	 */
	if (test_case.operation_type == OPERATION_TYPE_MULTIPLICATION &&
		Utils::isMatrixVariableType(test_case.variable_type))
	{
		Utils::_variable_type result_variable_type;
		Utils::_variable_type transposed_matrix_variable_type =
			Utils::getTransposedMatrixVariableType(test_case.variable_type);

		result_variable_type =
			Utils::getPostMatrixMultiplicationVariableType(test_case.variable_type, transposed_matrix_variable_type);
		result_variable_type_string = Utils::getVariableTypeString(result_variable_type);

		test_case.result_variable_type = result_variable_type;
	}

	/* Form the pre-amble */
	result_sstream << "#version 400\n"
					  "\n"

					  /* Add output variables */
					  "out "
				   << result_variable_type_string << " result;\n"
													 "out ivec2 result_lt;\n"
													 "out ivec2 result_lte;\n"
													 "out ivec2 result_gt;\n"
													 "out ivec2 result_gte;\n"
													 "void main()\n"
													 "{\n";

	/* Form reference values */
	result_sstream << variable_type_string << " reference1 = " << variable_type_string << "(";

	for (unsigned int n_variable_component = 0; n_variable_component < n_variable_components; ++n_variable_component)
	{
		result_sstream << (n_variable_component + 1);

		if (n_variable_component != (n_variable_components - 1))
		{
			result_sstream << ", ";
		}
	} /* for (all variable components) */

	result_sstream << ");\n";

	for (unsigned int n_ref2_case = 0; n_ref2_case < 2; /* single- and double-precision cases */
		 ++n_ref2_case)
	{
		Utils::_variable_type compatible_variable_type = test_case.variable_type;

		if (Utils::isMatrixVariableType(compatible_variable_type) &&
			test_case.operation_type == OPERATION_TYPE_MULTIPLICATION)
		{
			compatible_variable_type = Utils::getTransposedMatrixVariableType(compatible_variable_type);
		}

		std::string ref2_variable_type_fp_string =
			Utils::getFPVariableTypeStringForVariableType(compatible_variable_type);
		std::string ref2_variable_type_string = Utils::getVariableTypeString(compatible_variable_type);
		std::string ref2_variable_type = (n_ref2_case == 0) ? ref2_variable_type_fp_string : ref2_variable_type_string;
		std::string ref2_variable_name = (n_ref2_case == 0) ? "reference2f" : "reference2";

		result_sstream << ref2_variable_type << " " << ref2_variable_name << " = " << ref2_variable_type << "(";

		for (unsigned int n_variable_component = 0; n_variable_component < n_variable_components;
			 ++n_variable_component)
		{
			result_sstream << (n_variable_components - (n_variable_component + 1));

			if (n_variable_component != (n_variable_components - 1))
			{
				result_sstream << ", ";
			}
		} /* for (all variable components) */

		result_sstream << ");\n";
	} /* for (both reference2 declarations) */

	/* Add actual body */
	result_sstream << "\n"
					  "result = ";

	if (test_case.operation_type == OPERATION_TYPE_PRE_DECREMENTATION ||
		test_case.operation_type == OPERATION_TYPE_PRE_INCREMENTATION)
	{
		result_sstream << getOperatorForOperationType(test_case.operation_type);
	}

	result_sstream << "reference1 ";

	if (test_case.operation_type == OPERATION_TYPE_PRE_DECREMENTATION ||
		test_case.operation_type == OPERATION_TYPE_PRE_INCREMENTATION ||
		test_case.operation_type == OPERATION_TYPE_POST_DECREMENTATION ||
		test_case.operation_type == OPERATION_TYPE_POST_INCREMENTATION)
	{
		if (test_case.operation_type == OPERATION_TYPE_POST_DECREMENTATION ||
			test_case.operation_type == OPERATION_TYPE_POST_INCREMENTATION)
		{
			result_sstream << getOperatorForOperationType(test_case.operation_type);
		}
	}
	else
	{
		result_sstream << getOperatorForOperationType(test_case.operation_type) << " reference2";
	}

	result_sstream << ";\n";

	if (Utils::isScalarVariableType(test_case.variable_type))
	{
		result_sstream << "result_lt [0] = (reference1 <  reference2)  ? 1 : 0;\n"
						  "result_lt [1] = (reference1 <  reference2f) ? 1 : 0;\n"
						  "result_lte[0] = (reference1 <= reference2)  ? 1 : 0;\n"
						  "result_lte[1] = (reference1 <= reference2f) ? 1 : 0;\n"
						  "result_gt [0] = (reference1 >  reference2)  ? 1 : 0;\n"
						  "result_gt [1] = (reference1 >  reference2f) ? 1 : 0;\n"
						  "result_gte[0] = (reference1 >= reference2)  ? 1 : 0;\n"
						  "result_gte[1] = (reference1 >= reference2f) ? 1 : 0;\n";
	}
	else
	{
		result_sstream << "result_lt [0] = 1;\n"
						  "result_lt [1] = 1;\n"
						  "result_lte[0] = 1;\n"
						  "result_lte[1] = 1;\n"
						  "result_gt [0] = 1;\n"
						  "result_gt [1] = 1;\n"
						  "result_gte[0] = 1;\n"
						  "result_gte[1] = 1;\n";
	}

	result_sstream << "}\n";

	/* All done */
	return result_sstream.str();
}